

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O2

void VxSndLoadSound(char *filename,AudioSource *source)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  ALuint buffer;
  mp3dec_file_info_t info;
  
  iVar2 = mp3dec_load(&mp3Dec,filename,&info,(MP3D_PROGRESS_CB)0x0,(void *)0x0);
  if (iVar2 == 0) {
    uVar1 = (int)info.samples * 2;
    uVar3 = 0x1103;
    if ((char)info.channels != '\x02') {
      uVar3 = 0;
    }
    uVar4 = 0x1101;
    if ((char)info.channels != '\x01') {
      uVar4 = uVar3;
    }
    fVar5 = (float)uVar1 / ((float)info.avg_bitrate_kbps * 1024.0);
    alGenBuffers(1,&buffer);
    alBufferData(buffer,uVar4,info.buffer,uVar1,info.hz);
    source->bufferId = buffer;
    source->loaded = true;
    source->length = fVar5;
    alGenSources(1,&source->sourceId);
    alSourcei(source->sourceId,0x1009,buffer);
    puts("Loaded mp3 info:");
    printf("    Filename: %s\n",filename);
    printf("    Channels: %d\n",(ulong)(uint)info.channels);
    printf("    Sample Rate: %d\n",(ulong)(uint)info.hz);
    printf("    Size: %d bytes\n",(ulong)uVar1);
    printf("    Length: %f sec\n",(double)fVar5);
    iVar2 = alGetError();
    if (iVar2 != 0) {
      fwrite("Failed to setup audio source!\n",0x1e,1,_stderr);
    }
  }
  else {
    fprintf(_stderr,"Can\'t load %s!\n",filename);
    source->loaded = false;
  }
  return;
}

Assistant:

void VxSndLoadSound(const char* filename, AudioSource* const source) {
    mp3dec_file_info_t info;
    if (mp3dec_load(&mp3Dec, filename, &info, NULL, NULL)) {
        fprintf(stderr, "Can't load %s!\n", filename);
        source->loaded = false;
        return;
    }
    uint32_t size = info.samples * sizeof(mp3d_sample_t);

    int sampleRate = info.hz;
    int channels = info.channels;
    int alFormat = GetOpenALFormat(channels);
    float lengthSeconds = size / (info.avg_bitrate_kbps * 1024.0f);

    ALuint buffer;
    alGenBuffers(1, &buffer);
    alBufferData(buffer, alFormat, info.buffer, size, sampleRate);

    source->bufferId = buffer;
    source->loaded = true;
    source->length = lengthSeconds;

    alGenSources(1, &source->sourceId);
    alSourcei(source->sourceId, AL_BUFFER, buffer);

    printf("Loaded mp3 info:\n");
    printf("    Filename: %s\n", filename);
    printf("    Channels: %d\n", channels);
    printf("    Sample Rate: %d\n", sampleRate);
    printf("    Size: %d bytes\n", size);
    printf("    Length: %f sec\n", lengthSeconds);

    if (alGetError() != AL_NO_ERROR) {
        fprintf(stderr, "Failed to setup audio source!\n");
    }
}